

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

t_symbol * template_getsymbol(t_template *x,t_symbol *fieldname,t_word *wp,int loud)

{
  int iVar1;
  t_symbol *local_40;
  t_symbol *val;
  t_symbol *arraytype;
  int local_28;
  int type;
  int onset;
  int loud_local;
  t_word *wp_local;
  t_symbol *fieldname_local;
  t_template *x_local;
  
  local_40 = &s_;
  type = loud;
  _onset = wp;
  wp_local = (t_word *)fieldname;
  fieldname_local = (t_symbol *)x;
  iVar1 = template_find_field(x,fieldname,&local_28,(int *)((long)&arraytype + 4),&val);
  if (iVar1 == 0) {
    if (type != 0) {
      pd_error((void *)0x0,"%s.%s: no such field",fieldname_local->s_next->s_name,wp_local->w_symbol
              );
    }
  }
  else if (arraytype._4_4_ == 1) {
    local_40 = *(t_symbol **)((long)_onset + (long)local_28);
  }
  else if (type != 0) {
    pd_error((void *)0x0,"%s.%s: not a symbol",fieldname_local->s_next->s_name,wp_local->w_symbol);
  }
  return local_40;
}

Assistant:

t_symbol *template_getsymbol(t_template *x, t_symbol *fieldname, t_word *wp,
    int loud)
{
    int onset, type;
    t_symbol *arraytype;
    t_symbol *val = &s_;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
    {
        if (type == DT_SYMBOL)
            val = *(t_symbol **)(((char *)wp) + onset);
        else if (loud) pd_error(0, "%s.%s: not a symbol",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
    return (val);
}